

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.hpp
# Opt level: O1

void __thiscall
nonstd::expected_lite::
expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~expected(expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  long *plVar1;
  pointer *pppVar2;
  
  if ((this->contained).
      super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value == true) {
    std::
    vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&(this->contained).
                  super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_value.names);
    return;
  }
  plVar1 = (long *)(this->contained).
                   super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0.m_error._M_dataplus._M_p;
  pppVar2 = (pointer *)
            ((long)&(this->contained).
                    super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0.m_value.names.
                    super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if ((pointer *)plVar1 != pppVar2) {
    operator_delete(plVar1,(ulong)((long)&(*pppVar2)->first + 1));
    return;
  }
  return;
}

Assistant:

~expected()
    {
        if ( has_value() ) contained.destruct_value();
        else               contained.destruct_error();
    }